

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

void DrawTriangle(Vector2 v1,Vector2 v2,Vector2 v3,Color color)

{
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  
  rlCheckRenderBatchLimit(4);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  rlColor4ub(color.r,color.g,color.b,color.a);
  rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
  local_58 = v1.x;
  uStack_54 = v1.y;
  rlVertex2f(local_58,uStack_54);
  rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
               (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
  local_48 = v2.x;
  uStack_44 = v2.y;
  rlVertex2f(local_48,uStack_44);
  rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
               (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
  rlVertex2f(local_48,uStack_44);
  rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
               texShapesRec.y / (float)texShapes.height);
  local_38 = v3.x;
  uStack_34 = v3.y;
  rlVertex2f(local_38,uStack_34);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTriangle(Vector2 v1, Vector2 v2, Vector2 v3, Color color)
{
    rlCheckRenderBatchLimit(4);

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        rlColor4ub(color.r, color.g, color.b, color.a);

        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(v1.x, v1.y);

        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(v2.x, v2.y);

        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(v2.x, v2.y);

        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(v3.x, v3.y);
    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(v1.x, v1.y);
        rlVertex2f(v2.x, v2.y);
        rlVertex2f(v3.x, v3.y);
    rlEnd();
#endif
}